

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O0

int ulp_decrypt(ulp_ciphertext *ciphertext,ulp_private_key *priv_key,uint8_t **msg_p)

{
  uint64_t *in;
  uint8_t *out;
  uint64_t uVar1;
  undefined8 *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  size_t j;
  size_t i;
  uint8_t *msg;
  uint64_t *tmp;
  size_t num_bytes;
  uint64_t q;
  ulong b;
  ulong a;
  size_t local_28;
  int local_4;
  
  if ((in_RDI == (ulong *)0x0) || (in_RSI == (ulong *)0x0)) {
    local_4 = -1;
  }
  else if ((*in_RDI == *in_RSI) && (in_RDI[1] == in_RSI[1])) {
    local_28 = in_RSI[1] >> 3;
    if (local_28 << 3 != in_RSI[1]) {
      local_28 = local_28 + 1;
    }
    in = (uint64_t *)malloc(in_RSI[1] << 3);
    out = (uint8_t *)malloc(local_28);
    if ((in == (uint64_t *)0x0) || (out == (uint8_t *)0x0)) {
      free(in);
      free(out);
      local_4 = -1;
    }
    else {
      for (a = 0; a < in_RSI[1]; a = a + 1) {
        in[a] = *(uint64_t *)(in_RDI[3] + a * 8);
        for (b = 0; b < *in_RSI; b = b + 1) {
          q = in[a];
          uVar1 = mulmod(a,b,q);
          in[a] = (q + uVar1) % in_RSI[2];
        }
      }
      decode(in,out,in_RSI[1],in_RSI[2]);
      free(in);
      *in_RDX = out;
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int ulp_decrypt(ulp_ciphertext* ciphertext, ulp_private_key* priv_key, uint8_t** msg_p) {

    if(ciphertext == NULL || priv_key == NULL)
        return -1;

    if(ciphertext->n != priv_key->n || ciphertext->l != priv_key->l)
        return -2;

    // compute number of bytes needed for storing the decrypted plaintext
    size_t num_bytes = priv_key->l / 8;
    if(num_bytes * 8 != priv_key->l)
        num_bytes++;

    // allocate memory
    uint64_t* tmp = malloc(priv_key->l * sizeof(priv_key->q));
    uint8_t* msg = malloc(num_bytes);
    if(tmp == NULL || msg == NULL) {
        free(tmp);
        free(msg);
        return -1;
    }

    // S * c1 + c2
    for(size_t i = 0; i < priv_key->l; i++) {
        tmp[i] = ciphertext->c2[i];
        for(size_t j = 0; j < priv_key->n; j++) {
            tmp[i] = (tmp[i] + mulmod(priv_key->S[i*priv_key->n + j], ciphertext->c1[j], priv_key->q)) % priv_key->q;
        }
    }

    // decode decrypted message
    decode(tmp, msg, priv_key->l, priv_key->q);

    // exit properly
    free(tmp);
    *msg_p = msg;
    return 0;

}